

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precision.cpp
# Opt level: O2

float verify_accuracy<float,sumlib::neumaier,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                (undefined8 *param_1)

{
  ulong uVar1;
  pointer pfVar2;
  ulong *puVar3;
  ulong uVar4;
  pointer pfVar5;
  bool bVar6;
  float fVar7;
  vector<float,_std::allocator<float>_> numbers;
  float local_88;
  float local_84;
  undefined1 local_80 [20];
  float local_6c;
  _Vector_base<float,_std::allocator<float>_> local_68;
  ulong *local_48;
  ulong local_40;
  ulong *local_38;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (float *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (float *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (ulong *)*param_1;
  local_48 = (ulong *)param_1[1];
  local_88 = 0.0;
  while (puVar3 != local_48) {
    local_40 = *puVar3;
    uVar1 = puVar3[1];
    local_80._0_8_ = (ulong)(uint)puVar3[2] << 0x20;
    local_80._8_8_ = local_80._8_8_ & 0xffffff0000000000;
    uVar4 = local_40 >> 1;
    fVar7 = (float)(long)uVar1;
    local_38 = puVar3;
    while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
      local_6c = std::normal_distribution<float>::operator()
                           ((normal_distribution<float> *)local_80,
                            (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                             *)&stack0x00000008);
      local_84 = local_6c + fVar7;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                ((vector<float,_std::allocator<float>_> *)&local_68,&local_84);
      local_84 = fVar7 - local_6c;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                ((vector<float,_std::allocator<float>_> *)&local_68,&local_84);
    }
    local_88 = local_88 + (float)(uVar1 * local_40);
    puVar3 = local_38 + 3;
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             local_68._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             local_68._M_impl.super__Vector_impl_data._M_finish,
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)&stack0x00000008);
  pfVar2 = local_68._M_impl.super__Vector_impl_data._M_finish;
  local_80._0_8_ = &PTR_operator___00111ce8;
  local_80._8_4_ = 0.0;
  local_80[0xc] = false;
  local_80._13_3_ = 0;
  for (pfVar5 = local_68._M_impl.super__Vector_impl_data._M_start; pfVar5 != pfVar2;
      pfVar5 = pfVar5 + 1) {
    sumlib::neumaier<float>::operator+=((neumaier<float> *)local_80,*pfVar5);
  }
  fVar7 = (float)local_80._8_4_ + (float)local_80._12_4_;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_68);
  return fVar7 - local_88;
}

Assistant:

T verify_accuracy( vector<distribution<T>> dists, RNG rng ) {
    vector<T> numbers;
    T total = 0;
    for( distribution<T> d : dists ) {
        normal_distribution<T> nd( 0, d.deviation );

        for( uint64_t i = 0; i < (d.terms/2); i++ ) {
            T deviation = nd( rng );
            numbers.push_back( d.mean + deviation );
            numbers.push_back( d.mean - deviation );
        }

        total += d.terms * d.mean;
    }

    shuffle( numbers.begin(), numbers.end(), rng );

    SUMMER<T> sum;
    for( auto x : numbers )
        sum += x;

    return sum.get()-total;
}